

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationSymbolOccurrence::IfcAnnotationSymbolOccurrence
          (IfcAnnotationSymbolOccurrence *this,void **vtt)

{
  void **vtt_local;
  IfcAnnotationSymbolOccurrence *this_local;
  
  IfcAnnotationOccurrence::IfcAnnotationOccurrence(&this->super_IfcAnnotationOccurrence,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationSymbolOccurrence,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationSymbolOccurrence,_0UL> *)
             &(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x80,vtt + 0x10);
  *(void **)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem = *vtt;
  *(void **)(&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem + -0x18))
       = vtt[0x12];
  (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x13];
  *(void **)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x70 = vtt[0x14];
  *(void **)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x80 = vtt[0x15];
  return;
}

Assistant:

IfcAnnotationSymbolOccurrence() : Object("IfcAnnotationSymbolOccurrence") {}